

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool check_more_than_two_unique_values<double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action)

{
  size_t *psVar1;
  bool bVar2;
  ulong uVar3;
  double in_XMM0_Qa;
  
  if (end - st < 2) {
    return false;
  }
  if (missing_action == Fail) {
    uVar3 = st + 1;
    while (bVar2 = uVar3 <= end, uVar3 <= end) {
      psVar1 = ix_arr + uVar3;
      uVar3 = uVar3 + 1;
      if (x[*psVar1] != x[ix_arr[st]]) {
        return bVar2;
      }
      if (NAN(x[*psVar1]) || NAN(x[ix_arr[st]])) {
        return bVar2;
      }
    }
  }
  else {
    do {
      if (end < st) break;
      in_XMM0_Qa = x[ix_arr[st]];
      st = st + 1;
    } while (0x7fefffffffffffff < (ulong)ABS(in_XMM0_Qa));
    do {
      bVar2 = st <= end;
      if (end < st) {
        return bVar2;
      }
      psVar1 = ix_arr + st;
      st = st + 1;
    } while (in_XMM0_Qa == x[*psVar1] || 0x7fefffffffffffff < (ulong)ABS(x[*psVar1]));
  }
  return bVar2;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        real_t x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        real_t x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[ix]])))
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (!is_na_or_inf(x[ix_arr[ix]]) && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}